

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void load_pixel_w8(uint8_t *above,uint8_t *left,int height,__m128i *pixels)

{
  undefined8 uVar1;
  byte bVar2;
  longlong lVar3;
  ushort local_188;
  ushort uStack_180;
  byte bStack_d7;
  byte bStack_d6;
  byte bStack_d5;
  byte bStack_d4;
  byte bStack_d3;
  byte bStack_d2;
  byte bStack_d1;
  ulong local_a8;
  __m128i d;
  __m128i bp;
  __m128i zero;
  __m128i *pixels_local;
  ushort uStack_36;
  int height_local;
  uint8_t *left_local;
  uint8_t *above_local;
  ushort uStack_1e;
  ushort uStack_1c;
  ushort uStack_1a;
  ushort uStack_e;
  ushort uStack_c;
  ushort uStack_a;
  
  zero[1]._2_1_ = left[height + -1];
  uVar1 = *(undefined8 *)above;
  bStack_d7 = (byte)((ulong)uVar1 >> 8);
  bStack_d6 = (byte)((ulong)uVar1 >> 0x10);
  bStack_d5 = (byte)((ulong)uVar1 >> 0x18);
  bStack_d4 = (byte)((ulong)uVar1 >> 0x20);
  bStack_d3 = (byte)((ulong)uVar1 >> 0x28);
  bStack_d2 = (byte)((ulong)uVar1 >> 0x30);
  bStack_d1 = (byte)((ulong)uVar1 >> 0x38);
  local_188 = (ushort)(byte)uVar1;
  uStack_180 = (ushort)bStack_d4;
  uStack_36 = (ushort)bStack_d7;
  height_local._0_2_ = (ushort)bStack_d6;
  height_local._2_2_ = (ushort)bStack_d5;
  zero[1]._3_1_ = 0;
  zero[1]._5_1_ = 0;
  zero[1]._4_1_ = zero[1]._2_1_;
  zero[1]._7_1_ = 0;
  zero[1]._6_1_ = zero[1]._2_1_;
  *(ushort *)*pixels = local_188;
  *(ushort *)((long)*pixels + 2) = (ushort)zero[1]._2_1_;
  *(ushort *)((long)*pixels + 4) = uStack_36;
  *(ushort *)((long)*pixels + 6) = zero[1]._2_2_;
  *(ushort *)(*pixels + 1) = (ushort)height_local;
  *(ushort *)((long)*pixels + 10) = zero[1]._4_2_;
  *(ushort *)((long)*pixels + 0xc) = height_local._2_2_;
  *(ushort *)((long)*pixels + 0xe) = zero[1]._6_2_;
  uStack_e = (ushort)bStack_d3;
  uStack_c = (ushort)bStack_d2;
  uStack_a = (ushort)bStack_d1;
  uStack_1e = (ushort)zero[1]._2_1_;
  uStack_1c = (ushort)zero[1]._2_1_;
  uStack_1a = (ushort)zero[1]._2_1_;
  *(ushort *)pixels[1] = uStack_180;
  *(ushort *)((long)pixels[1] + 2) = (ushort)zero[1]._2_1_;
  *(ushort *)((long)pixels[1] + 4) = uStack_e;
  *(ushort *)((long)pixels[1] + 6) = uStack_1e;
  *(ushort *)(pixels[1] + 1) = uStack_c;
  *(ushort *)((long)pixels[1] + 10) = uStack_1c;
  *(ushort *)((long)pixels[1] + 0xc) = uStack_a;
  *(ushort *)((long)pixels[1] + 0xe) = uStack_1a;
  bVar2 = above[7];
  pixels[3][0] = (ulong)CONCAT16(bVar2,(uint6)CONCAT14(bVar2,(uint)CONCAT12(bVar2,(ushort)bVar2)));
  pixels[3][1] = (ulong)CONCAT16(bVar2,(uint6)CONCAT14(bVar2,(uint)CONCAT12(bVar2,(ushort)bVar2)));
  if (height == 4) {
    local_a8 = (ulong)*(uint *)left;
    pixels[2][0] = local_a8;
    pixels[2][1] = 0;
  }
  else if (height == 8) {
    pixels[2][0] = *(longlong *)left;
    pixels[2][1] = 0;
  }
  else if (height == 0x10) {
    lVar3 = *(longlong *)(left + 8);
    pixels[2][0] = *(longlong *)left;
    pixels[2][1] = lVar3;
  }
  else {
    lVar3 = *(longlong *)(left + 8);
    pixels[2][0] = *(longlong *)left;
    pixels[2][1] = lVar3;
    lVar3 = (*pixels)[1];
    pixels[4][0] = (*pixels)[0];
    pixels[4][1] = lVar3;
    lVar3 = pixels[1][1];
    pixels[5][0] = pixels[1][0];
    pixels[5][1] = lVar3;
    lVar3 = *(longlong *)(left + 0x18);
    pixels[6][0] = *(longlong *)(left + 0x10);
    pixels[6][1] = lVar3;
    lVar3 = pixels[3][1];
    pixels[7][0] = pixels[3][0];
    pixels[7][1] = lVar3;
  }
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}